

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::python::Generator::
PrintSerializedPbInterval<google::protobuf::ServiceDescriptor,google::protobuf::ServiceDescriptorProto>
          (Generator *this,ServiceDescriptor *descriptor,ServiceDescriptorProto *proto)

{
  Printer *this_00;
  LogMessage *other;
  int extraout_EDX;
  int i;
  unsigned_long i_00;
  undefined1 auVar1 [12];
  string sp;
  string local_b0;
  string local_90;
  string local_70;
  LogMessage local_50;
  
  ServiceDescriptor::CopyTo(descriptor,proto);
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  MessageLite::SerializeToString((MessageLite *)proto,&local_b0);
  auVar1 = std::__cxx11::string::find
                     ((char *)&this->file_descriptor_serialized_,(ulong)local_b0._M_dataplus._M_p,0)
  ;
  i = auVar1._8_4_;
  if (auVar1._0_4_ < 0) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/compiler/python/python_generator.cc"
               ,0x403);
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: (offset) >= (0): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_90,other);
    internal::LogMessage::~LogMessage(&local_50);
    i = extraout_EDX;
  }
  this_00 = this->printer_;
  SimpleItoa_abi_cxx11_(&local_90,(protobuf *)(auVar1._0_8_ & 0xffffffff),i);
  SimpleItoa_abi_cxx11_(&local_70,(protobuf *)((long)auVar1._0_4_ + local_b0._M_string_length),i_00)
  ;
  io::Printer::Print(this_00,
                     "serialized_start=$serialized_start$,\nserialized_end=$serialized_end$,\n",
                     "serialized_start",&local_90,"serialized_end",&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                             local_b0.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void Generator::PrintSerializedPbInterval(
    const DescriptorT& descriptor, DescriptorProtoT& proto) const {
  descriptor.CopyTo(&proto);
  string sp;
  proto.SerializeToString(&sp);
  int offset = file_descriptor_serialized_.find(sp);
  GOOGLE_CHECK_GE(offset, 0);

  printer_->Print("serialized_start=$serialized_start$,\n"
                  "serialized_end=$serialized_end$,\n",
                  "serialized_start", SimpleItoa(offset),
                  "serialized_end", SimpleItoa(offset + sp.size()));
}